

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O2

int h264_residual_cavlc(bitstream *str,h264_slice *slice,int32_t *block,int *num,int cat,int idx,
                       int start,int end,int maxnumcoeff)

{
  undefined8 uVar1;
  size_t sVar2;
  size_t sVar3;
  bitstream *pbVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t *puVar8;
  uint uVar9;
  int iVar10;
  uint32_t tzVlcIndex;
  uint32_t mode;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  uint32_t *val;
  uint32_t uVar14;
  bool bVar15;
  ulong uStack_80;
  uint auStack_78 [2];
  h264_slice *local_70;
  uint *local_68;
  uint32_t *local_60;
  uint local_54;
  uint32_t local_50;
  uint32_t s;
  bitstream *local_48;
  uint *local_40;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t total_coeff;
  uint32_t trailing_ones;
  
  puVar13 = auStack_78;
  uVar6 = (ulong)(uint)maxnumcoeff * 4 + 0xf & 0xfffffffffffffff0;
  local_68 = (uint *)((long)auStack_78 - uVar6);
  puVar8 = (uint32_t *)((long)local_68 - uVar6);
  local_60 = puVar8;
  s = cat;
  if (str->dir == VS_ENCODE) {
    local_48 = str;
    local_40 = auStack_78;
    local_38 = 0;
    local_34 = 0;
    uVar6 = 0;
    if (0 < maxnumcoeff) {
      uVar6 = (ulong)(uint)maxnumcoeff;
    }
    uVar7 = 0;
    uVar9 = 0;
    for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
      if (block[uVar12] != 0) {
        if (((long)uVar12 < (long)start) || ((long)end < (long)uVar12)) {
          puVar8[-2] = 0x25;
          puVar8[-1] = 0;
          sVar2 = *(size_t *)(puVar8 + -2);
          puVar8[-2] = 1;
          puVar8[-1] = 0;
          sVar3 = *(size_t *)(puVar8 + -2);
          puVar8[-2] = 0x10739a;
          puVar8[-1] = 0;
          fwrite("Non-zero coord outside of start..end\n",sVar2,sVar3,_stderr);
          puVar8[-2] = 1;
          puVar8[-1] = 0;
          return (int)*(undefined8 *)(puVar8 + -2);
        }
        uVar7 = uVar7 + 1;
        if ((block[uVar12] + 1U & 0xfffffffd) != 0) {
          uVar7 = 0;
        }
        puVar13 = (uint *)(ulong)(((int)uVar12 - start) - uVar9);
        uVar9 = uVar9 + 1;
        local_38 = uVar9;
        local_34 = uVar7;
      }
    }
    local_50 = (uint32_t)puVar13;
    uVar11 = (ulong)(start - 1);
    iVar10 = uVar9 - 1;
    for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
      uVar9 = block[uVar12];
      if (uVar9 != 0) {
        puVar8[iVar10] = ~(uint)uVar11 + (int)uVar12;
        local_68[iVar10] = uVar9;
        iVar10 = iVar10 + -1;
        uVar11 = uVar12 & 0xffffffff;
      }
    }
    if (3 < uVar7) {
      local_34 = 3;
    }
  }
  puVar8[-2] = 0x107130;
  puVar8[-1] = 0;
  iVar5 = h264_coeff_token(str,slice,cat,idx,&local_34,&local_38);
  puVar8[-2] = 1;
  tzVlcIndex = local_38;
  uVar14 = s;
  puVar13 = local_68;
  puVar8[-1] = 0;
  iVar10 = (int)*(undefined8 *)(puVar8 + -2);
  if (iVar5 == 0) {
    local_70 = slice;
    local_48 = str;
    if (num != (int *)0x0) {
      *num = local_38;
    }
    if (local_38 == 0) {
      uVar14 = 0;
LAB_00107238:
      iVar10 = 0;
      if (local_48->dir == VS_DECODE) {
        uVar6 = 0;
        uVar12 = 0;
        if (0 < maxnumcoeff) {
          uVar12 = (ulong)(uint)maxnumcoeff;
        }
        for (; uVar12 != uVar6; uVar6 = uVar6 + 1) {
          block[uVar6] = 0;
        }
        puVar8[-2] = 0xffffffff;
        puVar8[-1] = 0xffffffff;
        uVar6 = *(ulong *)(puVar8 + -2);
        while (uVar14 = uVar14 - 1, -1 < (int)uVar14) {
          iVar10 = (int)uVar6;
          uVar6 = (ulong)(iVar10 + local_60[uVar14 & 0x7fffffff] + 1);
          block[(int)(start + iVar10 + local_60[uVar14 & 0x7fffffff] + 1)] =
               local_68[uVar14 & 0x7fffffff];
        }
        iVar10 = 0;
      }
    }
    else {
      local_40 = auStack_78;
      uVar7 = (uint)(local_34 < 3 && 10 < local_38);
      puVar8[-2] = 1;
      puVar8[-1] = 0;
      uVar1 = *(undefined8 *)(puVar8 + -2);
      for (uVar6 = 0; pbVar4 = local_48, uVar6 < tzVlcIndex; uVar6 = uVar6 + 1) {
        uVar12 = (ulong)local_34;
        iVar10 = (int)uVar1;
        if (uVar6 < uVar12) {
          local_54 = *puVar13 >> 0x1f;
          puVar8[-2] = 0x1071b5;
          puVar8[-1] = 0;
          iVar5 = vs_u(pbVar4,&local_54,iVar10);
          if (iVar5 != 0) {
            return iVar10;
          }
          *puVar13 = iVar10 + local_54 * -2;
        }
        else {
          bVar15 = local_34 < 3;
          puVar8[-2] = 0x1071e9;
          puVar8[-1] = 0;
          iVar5 = h264_level(pbVar4,uVar7,(uint)(bVar15 && uVar6 == uVar12),(int32_t *)puVar13);
          if (iVar5 != 0) {
            return iVar10;
          }
          iVar10 = uVar7 + (uVar7 == 0);
          uVar7 = *puVar13;
          uVar9 = -uVar7;
          if (0 < (int)uVar7) {
            uVar9 = uVar7;
          }
          puVar8[-2] = 3;
          puVar8[-1] = 0;
          uVar7 = (uint)(iVar10 < 6 &&
                        (int)*(undefined8 *)(puVar8 + -2) << ((char)iVar10 - 1U & 0x1f) < (int)uVar9
                        ) + iVar10;
        }
        puVar13 = puVar13 + 1;
        tzVlcIndex = local_38;
        uVar14 = s;
      }
      mode = 0;
      if (uVar14 == 3) {
        mode = local_70->chroma_array_type;
      }
      if (tzVlcIndex < (end - start) + 1U) {
        puVar8[-2] = 0x1072a6;
        puVar8[-1] = 0;
        iVar10 = h264_total_zeros(pbVar4,mode,tzVlcIndex,&local_50);
      }
      else {
        puVar8[-2] = 0x107302;
        puVar8[-1] = 0;
        iVar10 = vs_infer(pbVar4,&local_50,0);
      }
      if (iVar10 == 0) {
        uVar6 = 0;
        val = local_60;
        uVar14 = local_50;
        do {
          pbVar4 = local_48;
          if (local_38 - 1 <= uVar6) {
            local_60[local_38 - 1] = uVar14;
            uVar14 = local_38;
            goto LAB_00107238;
          }
          puVar8[-2] = 0x107338;
          puVar8[-1] = 0;
          iVar10 = h264_run_before(pbVar4,uVar14,val);
          if (iVar10 != 0) goto LAB_00107369;
          uVar6 = uVar6 + 1;
          uVar14 = uVar14 - *val;
          val = val + 1;
        } while (-1 < (int)uVar14);
        puVar8[-2] = 0x14;
        puVar8[-1] = 0;
        sVar2 = *(size_t *)(puVar8 + -2);
        puVar8[-2] = 1;
        puVar8[-1] = 0;
        sVar3 = *(size_t *)(puVar8 + -2);
        puVar8[-2] = 0x107369;
        puVar8[-1] = 0;
        fwrite("zerosLeft underflow\n",sVar2,sVar3,_stderr);
LAB_00107369:
        puVar8[-2] = 1;
        puVar8[-1] = 0;
        iVar10 = (int)*(undefined8 *)(puVar8 + -2);
      }
      else {
        puVar8[-2] = 1;
        puVar8[-1] = 0;
        iVar10 = (int)*(undefined8 *)(puVar8 + -2);
      }
    }
  }
  return iVar10;
}

Assistant:

int h264_residual_cavlc(struct bitstream *str, struct h264_slice *slice, int32_t *block, int *num, int cat, int idx, int start, int end, int maxnumcoeff) {
	uint32_t total_coeff, trailing_ones;
	int i, j;
	int32_t tb[maxnumcoeff];
	uint32_t run[maxnumcoeff];
	int last;
	uint32_t total_zeros;
	if (str->dir == VS_ENCODE) {
		total_coeff = 0;
		trailing_ones = 0;
		for (i = 0; i < maxnumcoeff; i++)
			if (block[i]) {
				if (i < start || i > end) {
					fprintf(stderr, "Non-zero coord outside of start..end\n");
					return 1;
				}
				total_coeff++;
				if (abs(block[i]) == 1)
					trailing_ones++;
				else
					trailing_ones = 0;
				total_zeros = i + 1 - total_coeff - start;
			}
		last = start - 1;
		for (i = 0, j = total_coeff - 1; i < maxnumcoeff; i++) {
			if (block[i]) {
				run[j] = i - last - 1;
				tb[j] = block[i];
				last = i;
				j--;
			}
		}
		if (trailing_ones > 3)
			trailing_ones = 3;
	}
	if (h264_coeff_token(str, slice, cat, idx, &trailing_ones, &total_coeff)) return 1;
	if (num)
		*num = total_coeff;
	if (total_coeff) {
		int suffixLength;
		if (total_coeff > 10 && trailing_ones < 3)
			suffixLength = 1;
		else
			suffixLength = 0;
		for (i = 0; i < total_coeff; i++) {
			if (i < trailing_ones) {
				uint32_t s = tb[i] < 0;
				if (vs_u(str, &s, 1)) return 1;
				tb[i] = 1 - 2 * s;
			} else {
				int onebias = (i == trailing_ones && trailing_ones < 3);
				if (h264_level(str, suffixLength, onebias, &tb[i])) return 1;
				if (suffixLength == 0)
					suffixLength = 1;
				if (abs(tb[i]) > (3 << (suffixLength - 1)) && suffixLength < 6)
					suffixLength++;
			}
		}
		int mode;
		if (cat == H264_CTXBLOCKCAT_CHROMA_DC) {
			mode = slice->chroma_array_type;
		} else {
			mode = 0;
		}
		if (total_coeff < end - start + 1) {
			if (h264_total_zeros(str, mode, total_coeff, &total_zeros)) return 1;
		} else {
			if (vs_infer(str, &total_zeros, 0)) return 1;
		}
		int zerosLeft = total_zeros;
		for (i = 0; i < total_coeff - 1; i++) {
			if (h264_run_before(str, zerosLeft, &run[i])) return 1;
			zerosLeft -= run[i];
			if (zerosLeft < 0) {
				fprintf(stderr, "zerosLeft underflow\n");
				return 1;
			}
		}
		run[total_coeff-1] = zerosLeft;
	}
	if (str->dir == VS_DECODE) {
		for (i = 0; i < maxnumcoeff; i++)
			block[i] = 0;
		for (i = total_coeff - 1, j = -1; i >= 0; i--) {
			j += run[i] + 1;
			block[start + j] = tb[i];
		}
	}
	return 0;
}